

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setAllPagerFlags(sqlite3 *db)

{
  int local_1c;
  Db *pDStack_18;
  int n;
  Db *pDb;
  sqlite3 *db_local;
  
  if (db->autoCommit != '\0') {
    pDStack_18 = db->aDb;
    local_1c = db->nDb;
    while (0 < local_1c) {
      if (pDStack_18->pBt != (Btree *)0x0) {
        sqlite3BtreeSetPagerFlags
                  (pDStack_18->pBt,(uint)pDStack_18->safety_level | db->flags & 0x38U);
      }
      pDStack_18 = pDStack_18 + 1;
      local_1c = local_1c + -1;
    }
  }
  return;
}

Assistant:

static void setAllPagerFlags(sqlite3 *db){
  if( db->autoCommit ){
    Db *pDb = db->aDb;
    int n = db->nDb;
    assert( SQLITE_FullFSync==PAGER_FULLFSYNC );
    assert( SQLITE_CkptFullFSync==PAGER_CKPT_FULLFSYNC );
    assert( SQLITE_CacheSpill==PAGER_CACHESPILL );
    assert( (PAGER_FULLFSYNC | PAGER_CKPT_FULLFSYNC | PAGER_CACHESPILL)
             ==  PAGER_FLAGS_MASK );
    assert( (pDb->safety_level & PAGER_SYNCHRONOUS_MASK)==pDb->safety_level );
    while( (n--) > 0 ){
      if( pDb->pBt ){
        sqlite3BtreeSetPagerFlags(pDb->pBt,
                 pDb->safety_level | (db->flags & PAGER_FLAGS_MASK) );
      }
      pDb++;
    }
  }
}